

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntelligentKeyboard.cpp
# Opt level: O2

void __thiscall Atari::ST::IntelligentKeyboard::set_button_pressed(IntelligentKeyboard *this)

{
  int iVar1;
  int in_EDX;
  byte in_SIL;
  uint uVar2;
  
  iVar1 = 1;
  uVar2 = 1 << ((in_SIL ^ 1) & 0x1f);
  if (in_EDX == 0) {
    LOCK();
    this->mouse_y_multiplier_ = this->mouse_y_multiplier_ & ~uVar2;
    UNLOCK();
    iVar1 = 2;
  }
  else {
    LOCK();
    this->mouse_y_multiplier_ = this->mouse_y_multiplier_ | uVar2;
    UNLOCK();
  }
  LOCK();
  this->posted_button_state_ = this->posted_button_state_ | iVar1 << ((in_SIL ^ 1) * '\x02' & 0x1f);
  UNLOCK();
  return;
}

Assistant:

void IntelligentKeyboard::set_button_pressed(int index, bool is_pressed) {
	index ^= 1;		// The primary button is b1; the secondary is b0.

	const auto mask = 1 << index;
	const auto event_mask = 1 << (index << 1);
	if(is_pressed) {
		mouse_button_state_ |= mask;
		mouse_button_events_ |= event_mask;
	} else {
		mouse_button_state_ &= ~mask;
		mouse_button_events_ |= event_mask << 1;
	}
}